

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O1

void dmrC_show_identifier_stats(dmr_C *C)

{
  ident **ppiVar1;
  uint uVar2;
  ulong uVar3;
  ident *piVar4;
  long lVar5;
  int local_1b8 [2];
  int distribution [100];
  
  lVar5 = 0;
  fprintf(_stderr,"identifiers: %d hits, %d misses\n",(ulong)(uint)C->T->ident_hit,
          (ulong)(uint)C->T->ident_miss);
  memset(local_1b8,0,400);
  ppiVar1 = C->T->hash_table;
  do {
    piVar4 = (ident *)(ppiVar1 + lVar5);
    uVar2 = 0xffffffff;
    do {
      piVar4 = piVar4->next;
      uVar2 = uVar2 + 1;
    } while (piVar4 != (ident *)0x0);
    uVar3 = (ulong)uVar2;
    if (0x62 < uVar2) {
      uVar3 = 99;
    }
    local_1b8[uVar3] = local_1b8[uVar3] + 1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x2000);
  uVar3 = 0;
  do {
    if (local_1b8[uVar3] != 0) {
      fprintf(_stderr,"%2d: %d buckets\n",uVar3 & 0xffffffff);
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 100);
  return;
}

Assistant:

void dmrC_show_identifier_stats(struct dmr_C *C)
{
	int i;
	int distribution[100];

	fprintf(stderr, "identifiers: %d hits, %d misses\n", 
		C->T->ident_hit, C->T->ident_miss);

	for (i = 0; i < 100; i++)
		distribution[i] = 0;

	for (i = 0; i < IDENT_HASH_SIZE; i++) {
		struct ident *ident = C->T->hash_table[i];
		int count = 0;

		while (ident) {
			count++;
			ident = ident->next;
		}
		if (count > 99)
			count = 99;
		distribution[count]++;
	}

	for (i = 0; i < 100; i++) {
		if (distribution[i])
			fprintf(stderr, "%2d: %d buckets\n", i,
				distribution[i]);
	}
}